

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

RGB colorOfPoint(Point *point,Triangle *triangle)

{
  Point *pPVar1;
  Point a;
  Point a_00;
  RGB RVar2;
  RGB RVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Point PVar7;
  Vector VVar8;
  undefined8 local_248;
  Vector local_228 [4];
  undefined1 local_1f8 [8];
  Vector vp2;
  float fStack_1e4;
  float local_1e0;
  undefined1 local_1b8 [8];
  Vector edge2;
  Vector local_188 [4];
  undefined1 local_158 [8];
  Vector vp1;
  float fStack_144;
  float local_140;
  undefined1 local_118 [8];
  Vector edge1;
  Vector C;
  float denom;
  float local_f0;
  undefined1 local_e8 [8];
  Vector N;
  float fStack_d4;
  float local_d0;
  undefined1 local_a8 [8];
  Vector v0v2;
  float fStack_94;
  float local_90;
  undefined1 local_68 [8];
  Vector v0v1;
  undefined4 uStack_54;
  Point v2;
  Point v1;
  undefined4 uStack_34;
  Point v0;
  float v;
  float u;
  Triangle *triangle_local;
  Point *point_local;
  
  fVar6 = (triangle->x).z;
  v1.z = (triangle->x).x;
  uStack_34 = (triangle->x).y;
  v1.x = (triangle->y).z;
  pPVar1 = &triangle->y;
  v2.z = pPVar1->x;
  unique0x00012004 = pPVar1->y;
  v2.x = (triangle->z).z;
  v0v1.z = (triangle->z).x;
  uStack_54 = (triangle->z).y;
  PVar7 = operator-(*pPVar1,(Point *)&v1.z);
  local_90 = PVar7.z;
  v0v1.x = local_90;
  stack0xffffffffffffff68 = PVar7._0_8_;
  local_68._0_4_ = v0v2.z;
  local_68._4_4_ = fStack_94;
  a_00.z = v2.x;
  a_00.x = v0v1.z;
  a_00.y = (float)uStack_54;
  unique0x100004a4 = PVar7;
  PVar7 = operator-(a_00,(Point *)&v1.z);
  local_d0 = PVar7.z;
  v0v2.x = local_d0;
  stack0xffffffffffffff28 = PVar7._0_8_;
  local_a8._0_4_ = N.z;
  local_a8._4_4_ = fStack_d4;
  unique0x10000498 = PVar7;
  VVar8 = crossProduct((Vector *)local_68,(Vector *)local_a8);
  local_f0 = VVar8.z;
  N.x = local_f0;
  stack0xffffffffffffff08 = VVar8._0_8_;
  local_e8._0_4_ = C.z;
  local_e8._4_4_ = denom;
  fVar4 = dotProduct((Vector *)local_e8,(Vector *)local_e8);
  a.z = v2.x;
  a.x = v0v1.z;
  a.y = (float)uStack_54;
  PVar7 = operator-(a,(Point *)&v2.z);
  local_140 = PVar7.z;
  edge1.x = local_140;
  stack0xfffffffffffffeb8 = PVar7._0_8_;
  local_118._0_4_ = vp1.z;
  local_118._4_4_ = fStack_144;
  unique0x1000048c = PVar7;
  PVar7 = operator-(*point,(Point *)&v2.z);
  local_188[0].z = PVar7.z;
  vp1.x = local_188[0].z;
  local_188[0]._0_8_ = PVar7._0_8_;
  local_158._0_4_ = local_188[0].x;
  local_158._4_4_ = local_188[0].y;
  join_0x00001240_0x00001200_ = crossProduct((Vector *)local_118,(Vector *)local_158);
  stack0xfffffffffffffef8 = stack0xfffffffffffffe58;
  fVar5 = dotProduct((Vector *)local_e8,(Vector *)&edge1.z);
  PVar7.z = fVar6;
  PVar7.x = v1.z;
  PVar7.y = (float)uStack_34;
  PVar7 = operator-(PVar7,(Point *)&v0v1.z);
  local_1e0 = PVar7.z;
  edge2.x = local_1e0;
  stack0xfffffffffffffe18 = PVar7._0_8_;
  local_1b8._0_4_ = vp2.z;
  local_1b8._4_4_ = fStack_1e4;
  unique0x10000480 = PVar7;
  PVar7 = operator-(*point,(Point *)&v0v1.z);
  local_228[0].z = PVar7.z;
  vp2.x = local_228[0].z;
  local_228[0]._0_8_ = PVar7._0_8_;
  local_1f8._0_4_ = local_228[0].x;
  local_1f8._4_4_ = local_228[0].y;
  VVar8 = crossProduct((Vector *)local_1b8,(Vector *)local_1f8);
  local_248 = VVar8._0_8_;
  stack0xfffffffffffffef8 = local_248;
  fVar6 = dotProduct((Vector *)local_e8,(Vector *)&edge1.z);
  RVar2 = operator*(triangle->colorX,fVar5 / fVar4);
  RVar3 = operator*(triangle->colorY,fVar6 / fVar4);
  RVar2 = operator+(RVar2,RVar3);
  RVar3 = operator*(triangle->colorZ,(1.0 - fVar5 / fVar4) - fVar6 / fVar4);
  RVar2 = operator+(RVar2,RVar3);
  return RVar2;
}

Assistant:

RGB colorOfPoint(Point const& point, Triangle const& triangle)
{
  float u;
  float v;

  Point v0 = triangle.x;
  Point v1 = triangle.y;
  Point v2 = triangle.z;

  Vector v0v1 = v1 - v0;
  Vector v0v2 = v2 - v0;

  Vector N = crossProduct(v0v1, v0v2);
  float denom = dotProduct(N, N);

  Vector C;

  Vector edge1 = v2 - v1;
  Vector vp1 = point - v1;
  C = crossProduct(edge1, vp1);
  u = dotProduct(N, C);

  Vector edge2 = v0 - v2;
  Vector vp2 = point - v2;
  C = crossProduct(edge2, vp2);
  v = dotProduct(N, C);

  u /= denom;
  v /= denom;

  return triangle.colorX * u + triangle.colorY * v + triangle.colorZ * (1 - u - v);
}